

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

Span * __thiscall tcmalloc::PageHeap::Carve(PageHeap *this,Span *span,Length n)

{
  Span *span_00;
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  
  bVar3 = span->field_0x2b & 3;
  RemoveFromFreeList(this,span);
  span->field_0x2b = span->field_0x2b & 0xfc;
  uVar2 = (int)span->length - (int)n;
  if (0 < (int)uVar2) {
    span_00 = NewSpan(span->start + n,(ulong)(uVar2 & 0x7fffffff));
    *(uint *)&span_00->field_0x28 = *(uint *)&span_00->field_0x28 & 0xfcffffff | (uint)bVar3 << 0x18
    ;
    uVar1 = span_00->start;
    (this->pagemap_).root_[uVar1 >> 0x12]->values[(uint)uVar1 & 0x3ffff] = span_00;
    if (1 < span_00->length) {
      uVar1 = (uVar1 + span_00->length) - 1;
      (this->pagemap_).root_[uVar1 >> 0x12]->values[(uint)uVar1 & 0x3ffff] = span_00;
    }
    PrependToFreeList(this,span_00);
    span->length = n;
    uVar1 = (span->start + n) - 1;
    (this->pagemap_).root_[uVar1 >> 0x12]->values[(uint)uVar1 & 0x3ffff] = span;
  }
  if (bVar3 == 2) {
    CommitSpan(this,span);
  }
  return span;
}

Assistant:

Span* PageHeap::Carve(Span* span, Length n) {
  ASSERT(n > 0);
  ASSERT(span->location != Span::IN_USE);
  const int old_location = span->location;
  RemoveFromFreeList(span);
  span->location = Span::IN_USE;

  const int extra = span->length - n;
  ASSERT(extra >= 0);
  if (extra > 0) {
    Span* leftover = NewSpan(span->start + n, extra);
    leftover->location = old_location;
    RecordSpan(leftover);

    // The previous span of |leftover| was just splitted -- no need to
    // coalesce them. The next span of |leftover| was not previously coalesced
    // with |span|, i.e. is nullptr or has got location other than |old_location|.
#ifndef NDEBUG
    const PageID p = leftover->start;
    const Length len = leftover->length;
    Span* next = GetDescriptor(p+len);
    ASSERT (next == nullptr ||
            next->location == Span::IN_USE ||
            next->location != leftover->location);
#endif

    PrependToFreeList(leftover);  // Skip coalescing - no candidates possible
    span->length = n;
    pagemap_.set(span->start + n - 1, span);
  }
  ASSERT(Check());
  if (old_location == Span::ON_RETURNED_FREELIST) {
    // We need to recommit this address space.
    CommitSpan(span);
  }
  ASSERT(span->location == Span::IN_USE);
  ASSERT(span->length == n);
  ASSERT(stats_.unmapped_bytes+ stats_.committed_bytes==stats_.system_bytes);
  return span;
}